

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

size_t filter_letters(char *from,char *to)

{
  size_t sVar1;
  byte bVar2;
  byte *pbVar3;
  
  bVar2 = *from;
  if (bVar2 == 0) {
    sVar1 = 0;
  }
  else {
    pbVar3 = (byte *)(from + 1);
    sVar1 = 0;
    do {
      if ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) {
        to[sVar1] = bVar2;
        sVar1 = sVar1 + 1;
      }
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  to[sVar1] = '\0';
  return sVar1;
}

Assistant:

size_t filter_letters(const char* from, char* to) {
  size_t o = 0;
  for (size_t n = 0; from[n]; n++) {
    if ((from[n] >= 'A' && from[n] <= 'Z') || (from[n] >= 'a' && from[n] <= 'z')) {
      to[o++] = from[n];
    }
  }
  to[o] = 0;
  return o;
}